

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

cell * implementations::scheme::proc_sub(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  scheme *this;
  long lVar2;
  long extraout_RDX;
  long extraout_RDX_00;
  pointer pcVar3;
  string local_40;
  
  pcVar3 = (c->
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           )._M_impl.super__Vector_impl_data._M_start;
  this = (scheme *)atol((pcVar3->val)._M_dataplus._M_p);
  pcVar1 = (c->
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = extraout_RDX;
  while (pcVar3 + 1 != pcVar1) {
    lVar2 = atol(pcVar3[1].val._M_dataplus._M_p);
    this = this + -lVar2;
    lVar2 = extraout_RDX_00;
    pcVar3 = pcVar3 + 1;
  }
  str_abi_cxx11_(&local_40,this,lVar2);
  __return_storage_ptr__->type = Number;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->val,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  (__return_storage_ptr__->list).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->list).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->list).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->env).
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->env).
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cell proc_sub(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i) n -= atol(i->val.c_str());
	return cell(Number, str(n));
}